

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_aead__build_iv(ptls_aead_context_t *ctx,uint8_t *iv,uint64_t seq)

{
  byte *local_40;
  uint8_t *d;
  uint8_t *s;
  size_t i;
  size_t iv_size;
  uint64_t seq_local;
  uint8_t *iv_local;
  ptls_aead_context_t *ctx_local;
  
  local_40 = iv;
  d = ctx->static_iv;
  for (s = (uint8_t *)(ctx->algo->iv_size - 8); s != (uint8_t *)0x0; s = s + -1) {
    *local_40 = *d;
    local_40 = local_40 + 1;
    d = d + 1;
  }
  s = (uint8_t *)0x40;
  do {
    s = s + -8;
    *local_40 = *d ^ (byte)(seq >> ((byte)s & 0x3f));
    local_40 = local_40 + 1;
    d = d + 1;
  } while (s != (uint8_t *)0x0);
  return;
}

Assistant:

void ptls_aead__build_iv(ptls_aead_context_t *ctx, uint8_t *iv, uint64_t seq)
{
    size_t iv_size = ctx->algo->iv_size, i;
    const uint8_t *s = ctx->static_iv;
    uint8_t *d = iv;

    /* build iv */
    for (i = iv_size - 8; i != 0; --i)
        *d++ = *s++;
    i = 64;
    do {
        i -= 8;
        *d++ = *s++ ^ (uint8_t)(seq >> i);
    } while (i != 0);
}